

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O1

void * __thiscall mymalloc::Heap::malloc(Heap *this,size_t __size)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  Cache *this_00;
  mapped_type *ppCVar3;
  _Base_ptr p_Var4;
  int size;
  _Base_ptr p_Var5;
  id id;
  key_type local_28;
  
  size = (int)__size;
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JameyWoo[P]mymalloc/heap.cpp"
                  ,0x12,"void *mymalloc::Heap::malloc(int)");
  }
  if (0x8000 < size) {
    pvVar2 = bigObjectMalloc(this,size);
    return pvVar2;
  }
  local_28._M_thread = pthread_self();
  p_Var1 = &(this->cacheMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->cacheMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0;
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < local_28._M_thread]) {
    if (*(ulong *)(p_Var5 + 1) >= local_28._M_thread) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, local_28._M_thread < *(ulong *)(p_Var4 + 1))) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    this_00 = (Cache *)operator_new(0xed8);
    Cache::Cache(this_00,(Central *)&this->field_0x60,&this->spanMap);
    ppCVar3 = std::
              map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
              ::operator[](&this->cacheMap,&local_28);
    *ppCVar3 = this_00;
  }
  ppCVar3 = std::
            map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
            ::operator[](&this->cacheMap,&local_28);
  pvVar2 = Cache::malloc(*ppCVar3,__size & 0xffffffff);
  return pvVar2;
}

Assistant:

void *mymalloc::Heap::malloc(int size) {
    assert(size > 0);  // 要分配内存必须size > 0
    if (size > maxSmallObjectSize) {  // 大对象分配
        return bigObjectMalloc(size);
    }

    Cache* cache;
    auto id = std::this_thread::get_id();
    // 选择对应的 Cache结构来进行内存分配
    if (this->cacheMap.find(id) == this->cacheMap.end()) {
        // 如果没有当前线程id的缓存结构, 那么创建一个
        cache = new Cache(this->ctls, &this->spanMap);
        this->cacheMap[id] = cache;  // 把 central 数组的地址传进去
    }
    cache = this->cacheMap[id];
    return cache->malloc(size);
}